

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int target_data_update(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                      int64_t *arg_sizes,int64_t *arg_types)

{
  _Rb_tree_header *p_Var1;
  undefined8 *HstPtrBegin;
  long Size;
  undefined8 *puVar2;
  DeviceTy *pDVar3;
  int32_t iVar4;
  void *TgtPtrBegin;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool IsLast;
  pthread_mutex_t *local_70;
  DeviceTy *local_68;
  int32_t local_5c;
  ulong local_58;
  int64_t *local_50;
  void *local_48;
  void **local_40;
  int64_t *local_38;
  
  local_70 = (pthread_mutex_t *)&Device->ShadowMtx;
  p_Var1 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header;
  uVar8 = 0;
  uVar7 = 0;
  local_68 = Device;
  local_5c = arg_num;
  local_58 = uVar7;
  local_50 = arg_types;
  local_40 = args;
  local_38 = arg_sizes;
  if (0 < arg_num) {
    uVar7 = (ulong)(uint)arg_num;
    local_58 = uVar7;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    if ((*(ushort *)(arg_types + uVar8) & 0x180) == 0) {
      HstPtrBegin = (undefined8 *)local_40[uVar8];
      Size = local_38[uVar8];
      TgtPtrBegin = DeviceTy::getTgtPtrBegin(Device,HstPtrBegin,Size,&IsLast,false);
      pDVar3 = local_68;
      Device = local_68;
      if (TgtPtrBegin != (void *)0x0) {
        uVar6 = arg_types[uVar8];
        if ((uVar6 & 2) != 0) {
          local_48 = TgtPtrBegin;
          iVar4 = DeviceTy::data_retrieve(local_68,HstPtrBegin,TgtPtrBegin,Size);
          if (iVar4 != 0) break;
          std::mutex::lock((mutex *)&local_70->__data);
          uVar7 = local_58;
          for (p_Var5 = (pDVar3->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != p_Var1;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            puVar2 = *(undefined8 **)(p_Var5 + 1);
            if (HstPtrBegin <= puVar2) {
              if ((undefined8 *)(Size + (long)HstPtrBegin) <= puVar2) break;
              *puVar2 = p_Var5[1]._M_parent;
            }
          }
          pthread_mutex_unlock(local_70);
          uVar6 = local_50[uVar8];
          TgtPtrBegin = local_48;
          arg_types = local_50;
        }
        pDVar3 = local_68;
        Device = local_68;
        if ((uVar6 & 1) != 0) {
          iVar4 = DeviceTy::data_submit(local_68,TgtPtrBegin,HstPtrBegin,Size);
          if (iVar4 != 0) break;
          std::mutex::lock((mutex *)&local_70->__data);
          for (p_Var5 = (pDVar3->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != p_Var1;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            if (HstPtrBegin <= *(undefined8 **)(p_Var5 + 1)) {
              if ((undefined8 *)(Size + (long)HstPtrBegin) <= *(undefined8 **)(p_Var5 + 1)) break;
              iVar4 = DeviceTy::data_submit(local_68,p_Var5[1]._M_left,&p_Var5[1]._M_right,8);
              if (iVar4 != 0) {
                pthread_mutex_unlock(local_70);
                goto LAB_00107013;
              }
            }
          }
          pthread_mutex_unlock(local_70);
          uVar7 = local_58;
          arg_types = local_50;
          Device = local_68;
        }
      }
    }
  }
LAB_00107013:
  return -(uint)((long)uVar8 < (long)local_5c);
}

Assistant:

int target_data_update(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t MapSize = arg_sizes[i];
    bool IsLast;
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, MapSize, IsLast,
        false);
    if (!TgtPtrBegin) {
      DP("hst data:" DPxMOD " not found, becomes a noop\n", DPxPTR(HstPtrBegin));
      continue;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
      DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
      int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data from device failed.\n");
        return OFFLOAD_FAIL;
      }

      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original host pointer value " DPxMOD " for host pointer "
            DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
            DPxPTR(ShadowHstPtrAddr));
        *ShadowHstPtrAddr = it->second.HstPtrVal;
      }
      Device.ShadowMtx.unlock();
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
      int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original target pointer value " DPxMOD " for target "
            "pointer " DPxMOD "\n", DPxPTR(it->second.TgtPtrVal),
            DPxPTR(it->second.TgtPtrAddr));
        rt = Device.data_submit(it->second.TgtPtrAddr,
            &it->second.TgtPtrVal, sizeof(void *));
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          Device.ShadowMtx.unlock();
          return OFFLOAD_FAIL;
        }
      }
      Device.ShadowMtx.unlock();
    }
  }
  return OFFLOAD_SUCCESS;
}